

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedDecimalInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  string *text;
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    text = &(this->tokenizer_).current_.text;
    uVar1 = (this->tokenizer_).current_.text._M_string_length;
    if ((uVar1 < 2) ||
       (((pcVar2 = (text->_M_dataplus)._M_p, *pcVar2 != '0' || ((pcVar2[1] & 0xdfU) != 0x58)) &&
        ((uVar1 < 2 ||
         ((pcVar2 = (text->_M_dataplus)._M_p, *pcVar2 != '0' || ((pcVar2[1] & 0xf8U) != 0x30))))))))
    {
      bVar3 = io::Tokenizer::ParseInteger(text,max_value,value);
      if (bVar3) {
        io::Tokenizer::Next(&this->tokenizer_);
        return true;
      }
      std::operator+(&local_38,"Integer out of range (",text);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_58.field_2._M_allocated_capacity = *psVar5;
        local_58.field_2._8_8_ = plVar4[3];
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar5;
        local_58._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_58._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_58
                 );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return false;
      }
      goto LAB_0033ab52;
    }
    std::operator+(&local_58,"Expect a decimal number, got: ",text);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_58);
  }
  else {
    std::operator+(&local_58,"Expected integer, got: ",&(this->tokenizer_).current_.text);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_58);
  }
  local_38.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
  local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    return false;
  }
LAB_0033ab52:
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool ConsumeUnsignedDecimalInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    const string& text = tokenizer_.current().text;
    if (IsHexNumber(text) || IsOctNumber(text)) {
      ReportError("Expect a decimal number, got: " + text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(text, max_value, value)) {
      ReportError("Integer out of range (" + text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }